

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

char * __thiscall TCLAP::ArgException::what(ArgException *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (what()::ex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&what()::ex_abi_cxx11_);
    if (iVar1 != 0) {
      what()::ex_abi_cxx11_._M_dataplus._M_p = (pointer)&what()::ex_abi_cxx11_.field_2;
      what()::ex_abi_cxx11_._M_string_length = 0;
      what()::ex_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&what()::ex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&what()::ex_abi_cxx11_);
    }
  }
  std::operator+(&bStack_48,&this->_argId," -- ");
  std::operator+(&local_28,&bStack_48,&this->_errorText);
  std::__cxx11::string::operator=((string *)&what()::ex_abi_cxx11_,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&bStack_48);
  return what()::ex_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* what() const throw() 
		{
			static std::string ex; 
			ex = _argId + " -- " + _errorText;
			return ex.c_str();
		}